

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O1

void fiobj_ary_unshift(FIOBJ ary,FIOBJ obj)

{
  void *ptr;
  void *pvVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  
  if ((((ary != 0) && ((~(uint)ary & 6) != 0)) && ((ary & 1) == 0)) &&
     (*(char *)(ary & 0xfffffffffffffff8) == ')')) {
    if (*(long *)(ary + 8) == 0) {
      ptr = *(void **)(ary + 0x20);
      uVar3 = (*(ulong *)(ary + 0x10) & 0xfffffffffffffffe) + 10;
      if (*(ulong *)(ary + 0x18) <= uVar3) {
        pvVar1 = fio_malloc(uVar3 * 8);
        *(void **)(ary + 0x20) = pvVar1;
        if (pvVar1 == (void *)0x0) {
          if (0 < FIO_LOG_LEVEL) {
            FIO_LOG2STDERR(
                          "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4933"
                          );
          }
          kill(0,2);
          piVar2 = __errno_location();
          exit(*piVar2);
        }
        *(ulong *)(ary + 0x18) = uVar3;
      }
      lVar4 = *(long *)(ary + 0x10);
      *(long *)(ary + 0x10) = *(long *)(ary + 0x18);
      lVar4 = lVar4 - *(long *)(ary + 8);
      if (lVar4 != 0) {
        memmove((void *)((*(long *)(ary + 0x18) - lVar4) * 8 + *(long *)(ary + 0x20)),
                (void *)((long)ptr + *(long *)(ary + 8) * 8),lVar4 * 8);
      }
      *(long *)(ary + 8) = *(long *)(ary + 0x10) - lVar4;
      if (ptr != *(void **)(ary + 0x20)) {
        fio_free(ptr);
      }
    }
    lVar4 = *(long *)(ary + 8);
    *(long *)(ary + 8) = lVar4 + -1;
    *(FIOBJ *)(*(long *)(ary + 0x20) + -8 + lVar4 * 8) = obj;
    return;
  }
  __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                ,0xab,"void fiobj_ary_unshift(FIOBJ, FIOBJ)");
}

Assistant:

void fiobj_ary_unshift(FIOBJ ary, FIOBJ obj) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  fio_ary___unshift(&obj2ary(ary)->ary, obj);
}